

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_realm(void)

{
  magic_realm *pmVar1;
  magic_realm *p;
  
  p = realms;
  while (p != (magic_realm *)0x0) {
    pmVar1 = p->next;
    string_free(p->name);
    string_free(p->verb);
    string_free(p->spell_noun);
    string_free(p->book_noun);
    mem_free(p);
    p = pmVar1;
  }
  return;
}

Assistant:

static void cleanup_realm(void)
{
	struct magic_realm *p = realms;
	struct magic_realm *next;

	while (p) {
		next = p->next;
		string_free(p->name);
		string_free(p->verb);
		string_free(p->spell_noun);
		string_free(p->book_noun);
		mem_free(p);
		p = next;
	}
}